

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

string * nonius::detail::escape
                   (string *__return_storage_ptr__,string *source,
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *escapes)

{
  char *pcVar1;
  char cVar2;
  size_type sVar3;
  long lVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __hash_code __code;
  size_type sVar7;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar8;
  long lVar9;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar10;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar11;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar12;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar13;
  bool bVar14;
  string magic;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  string *local_40;
  _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  std::__cxx11::string::reserve((ulong)&local_60);
  p_Var6 = (escapes->_M_h)._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      std::__cxx11::string::push_back((char)&local_60);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  puVar13 = (unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(source->_M_dataplus)._M_p;
  sVar3 = source->_M_string_length;
  local_38 = &escapes->_M_h;
  if (sVar3 != 0) {
    sVar7 = 0;
    lVar9 = 0;
    local_40 = source;
    do {
      lVar4 = std::__cxx11::string::find
                        ((char)&local_60,
                         (ulong)(uint)(int)*(char *)((long)&(puVar13->_M_h)._M_buckets + sVar7));
      lVar9 = lVar9 + (ulong)(lVar4 != -1);
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
    escapes = (unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(lVar9 * 2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (sVar3 != 0) {
    puVar12 = (unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&(puVar13->_M_h)._M_buckets + sVar3);
    do {
      puVar8 = puVar13;
      puVar10 = escapes;
      do {
        puVar11 = puVar10;
        bVar14 = local_58 == 0;
        if (local_58 != 0) {
          cVar2 = *(char *)&(puVar8->_M_h)._M_buckets;
          if (cVar2 == *local_60) {
            bVar14 = false;
            puVar11 = puVar8;
          }
          else {
            lVar9 = 1;
            do {
              bVar14 = local_58 == lVar9;
              puVar11 = puVar10;
              if (bVar14) break;
              pcVar1 = local_60 + lVar9;
              lVar9 = lVar9 + 1;
              puVar11 = puVar8;
            } while (cVar2 != *pcVar1);
          }
        }
        escapes = puVar11;
      } while ((bVar14) &&
              (puVar8 = (unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&(puVar8->_M_h)._M_buckets + 1), escapes = puVar12,
              puVar10 = puVar11, puVar8 != puVar12));
      if (0 < (long)escapes - (long)puVar13) {
        lVar9 = ((long)escapes - (long)puVar13) + 1;
        do {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      if (escapes != puVar12) {
        __code = (__hash_code)*(char *)&(escapes->_M_h)._M_buckets;
        p_Var5 = std::
                 _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           (local_38,__code % local_38->_M_bucket_count,(key_type *)escapes,__code);
        if (p_Var5 == (__node_base_ptr)0x0) {
          p_Var6 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var6 = p_Var5->_M_nxt;
        }
        if (p_Var6 != (_Hash_node_base *)0x0) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var6[2]._M_nxt);
        }
        escapes = (unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&(escapes->_M_h)._M_buckets + 1);
      }
      puVar13 = escapes;
    } while (escapes != puVar12);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape(std::string const& source, std::unordered_map<char, std::string> const& escapes) {
            std::string magic;
            magic.reserve(escapes.size());
            std::transform(escapes.begin(), escapes.end(), std::back_inserter(magic), [](std::pair<char const, std::string> const& p) { return p.first; });

            auto first = source.begin();
            auto last = source.end();

            auto n_magic = std::count_if(first, last, [&magic](char c) { return magic.find(c) != std::string::npos; });

            std::string escaped;
            escaped.reserve(source.size() + n_magic*6);

            while(first != last) {
                auto next_magic = std::find_first_of(first, last, magic.begin(), magic.end());
                std::copy(first, next_magic, std::back_inserter(escaped));
                first = next_magic;
                if(first != last) {
                    auto it = escapes.find(*first);
                    if(it != escapes.end()) {
                        escaped += it->second;
                    }
                    ++first;
                }
            }
            return escaped;
        }